

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Coproduct.hpp
# Opt level: O0

size_t __thiscall
std::
hash<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
::operator()(hash<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             *this,Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   *self)

{
  uint uVar1;
  size_t sVar2;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict3
  RVar3;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *in_RSI;
  hash<unsigned_int> local_11;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *local_10;
  
  local_10 = in_RSI;
  uVar1 = Lib::
          Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ::tag((Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 *)0x3758d8);
  sVar2 = hash<unsigned_int>::operator()(&local_11,uVar1);
  RVar3 = Lib::
          Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::operator()(local_10);
  uVar1 = Lib::HashUtils::combine((uint)sVar2,(uint)RVar3);
  return (ulong)uVar1;
}

Assistant:

size_t operator()(Lib::Coproduct<Ts...> const& self) const
  {
    return Lib::HashUtils::combine(
        std::hash<unsigned>{}(self.tag()),
        self.apply([](auto const& x){ return std::hash<std::remove_const_t<std::remove_reference_t<decltype(x)>>>{}(x); }));
  }